

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O2

void __thiscall Simulator::fetch(Simulator *this)

{
  uint32_t *puVar1;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t uVar8;
  ulong uVar9;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  ulong uStack_60;
  InstSet local_54;
  uint local_50;
  long lVar10;
  
  uVar9 = (this->f_reg).out.pred_pc;
  if ((uVar9 & 1) != 0) {
    raiseError(this,"PC 0x%llx is illegal!\n",uVar9);
  }
  if ((this->e_reg).super_ClockReg<Simulator::ERegX>.out.opcode == 0x67) {
    uVar9 = (long)(this->e_reg).super_ClockReg<Simulator::ERegX>.out.imm +
            (this->e_reg).super_ClockReg<Simulator::ERegX>.out.val1 & 0xfffffffffffffffe;
  }
  if ((this->m_reg).super_ClockReg<Simulator::MRegX>.out.opcode == 99) {
    puVar1 = &(this->history).branch_count;
    *puVar1 = *puVar1 + 1;
    bVar2 = BranchPredictor::predict
                      (this->branch_predictor,
                       (uint32_t)(this->m_reg).super_ClockReg<Simulator::MRegX>.out.pc,
                       (long)(this->m_reg).super_ClockReg<Simulator::MRegX>.out.imm);
    BranchPredictor::update
              (this->branch_predictor,
               (uint32_t)(this->m_reg).super_ClockReg<Simulator::MRegX>.out.pc,
               (this->m_reg).super_ClockReg<Simulator::MRegX>.out.valE != 0);
    if ((this->m_reg).super_ClockReg<Simulator::MRegX>.out.valE == (ulong)bVar2) {
      puVar1 = &(this->history).predicted_success;
      *puVar1 = *puVar1 + 1;
    }
    else {
      lVar10 = 4;
      if (!bVar2) {
        lVar10 = (long)(this->m_reg).super_ClockReg<Simulator::MRegX>.out.imm;
      }
      uVar9 = lVar10 + (this->m_reg).super_ClockReg<Simulator::MRegX>.out.pc;
      puVar1 = &(this->history).predicted_unsuccess;
      *puVar1 = *puVar1 + 1;
    }
  }
  uVar4 = MemoryManager::getInt(this->memory,(uint32_t)uVar9,(uint32_t *)0x0);
  if (this->is_verbose == true) {
    printf("\tINST:%x",(ulong)uVar4);
  }
  uVar15 = uVar4 >> 0xc & 7;
  uVar11 = uVar4 >> 0xf & 0x1f;
  uVar5 = uVar4 >> 0x14;
  local_50 = uVar5 & 0x1f;
  uVar6 = uVar4 >> 7;
  uVar14 = uVar6 & 0x1f;
  uVar13 = uVar4 & 0x7f;
  if (uVar13 == 0) {
    uVar5 = 0;
    local_54 = UNKNOWN;
    goto LAB_00108316;
  }
  uVar7 = (ulong)uVar15;
  if (uVar13 == 3) {
    switch(uVar15) {
    case 0:
      uStack_60._0_4_ = LB;
      break;
    case 1:
      uStack_60._0_4_ = LH;
      break;
    case 2:
      uStack_60._0_4_ = LW;
      break;
    case 3:
      uStack_60._0_4_ = LD;
      break;
    case 4:
      uStack_60._0_4_ = LBU;
      break;
    case 5:
      uStack_60._0_4_ = LHU;
      break;
    case 6:
      uStack_60._0_4_ = LWU;
      break;
    case 7:
      pcVar12 = "Invaild LOAD Instruction at %x, The Func Field %x is invaild\n";
      uStack_60 = 7;
      goto LAB_001084de;
    }
LAB_001082e1:
    local_54 = (InstSet)uStack_60;
    uVar5 = (int)uVar4 >> 0x14;
  }
  else {
    if (uVar13 == 0x13) {
      switch(uVar15) {
      case 0:
        uStack_60._0_4_ = ADDI;
        break;
      case 1:
        uStack_60._0_4_ = SLLI;
        break;
      case 2:
        uStack_60._0_4_ = SLTI;
        break;
      case 3:
        uStack_60._0_4_ = SLTIU;
        break;
      case 4:
        uStack_60._0_4_ = XORI;
        break;
      case 5:
        uVar5 = uVar4 >> 0x1a;
        uVar7 = (ulong)uVar5;
        if (uVar5 == 0) {
          uStack_60._0_4_ = SRLI;
        }
        else {
          if (uVar5 != 0x10) {
            pcVar12 = 
            "Invaild RI Instruction at %x, The Func3 field is %x, The Func7 Field %x is invaild\n";
            goto LAB_001085ab;
          }
          uStack_60._0_4_ = SRAI;
        }
        break;
      case 6:
        uStack_60._0_4_ = ORI;
        break;
      case 7:
        uStack_60._0_4_ = ANDI;
      }
      goto LAB_001082e1;
    }
    if (uVar13 == 0x17) {
      uVar5 = uVar4 & 0xfffff000;
      uStack_60._0_4_ = AUIPC;
      goto LAB_00107fba;
    }
    if (uVar13 == 0x1b) {
      if (uVar15 == 0) {
        uStack_60._0_4_ = ADDIW;
      }
      else if (uVar15 == 5) {
        if ((uVar4 & 0xc0000000) == 0x40000000) {
          uStack_60._0_4_ = SRAIW;
        }
        else {
          if (0x3fffffff < uVar4) {
            pcVar12 = "Invaild RIW Instruction at %x, The Func Field %x is invaild\n";
            uStack_60 = 5;
            goto LAB_001084de;
          }
          uStack_60._0_4_ = SRLIW;
        }
      }
      else {
        if (uVar15 != 1) {
          pcVar12 = "Invaild RIW Instruction at %x, The Func Field %x is invaild\n";
          goto LAB_001084d5;
        }
        uStack_60._0_4_ = SLLIW;
      }
      goto LAB_001082e1;
    }
    if (uVar13 == 0x23) {
      if (uVar15 < 4) {
        local_54 = *(InstSet *)(&DAT_0010d168 + uVar7 * 4);
        uVar8 = uVar4 & 0xfe000000 | uVar14 << 0x14;
        uVar14 = 0;
LAB_0010804e:
        uVar5 = (int)uVar8 >> 0x14;
        goto LAB_00108316;
      }
      pcVar12 = "Invaild STORE Instruction at %x, The Func Field %x is invaild\n";
LAB_001084d5:
      uStack_60 = (ulong)uVar15;
LAB_001084de:
      raiseError(this,pcVar12,uVar9,uStack_60);
    }
    if (uVar13 == 0x33) {
      switch(uVar15) {
      case 0:
        if (uVar4 < 0x2000000) {
          uStack_60._0_4_ = ADD;
        }
        else if (uVar4 >> 0x19 == 1) {
          uStack_60._0_4_ = MUL;
        }
        else {
          if (uVar4 >> 0x19 != 0x20) {
            pcVar12 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
LAB_00108599:
            uVar7 = (ulong)(uVar4 >> 0x19);
            uStack_60 = 0;
            goto LAB_001085b5;
          }
          uStack_60._0_4_ = SUB;
        }
        break;
      case 1:
        if (uVar4 < 0x2000000) {
          uStack_60._0_4_ = SLL;
        }
        else {
          uVar7 = (ulong)(uVar4 >> 0x19);
          if (uVar4 >> 0x19 != 1) {
            pcVar12 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
            uStack_60 = 1;
            goto LAB_001085b5;
          }
          uStack_60._0_4_ = MULH;
        }
        break;
      case 2:
        if (uVar4 < 0x2000000) {
          uStack_60._0_4_ = SLT;
        }
        else {
          uVar7 = (ulong)(uVar4 >> 0x19);
          if (uVar4 >> 0x19 != 1) {
            pcVar12 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
            uStack_60 = 2;
            goto LAB_001085b5;
          }
          uStack_60._0_4_ = MULHSU;
        }
        break;
      case 3:
        if (uVar4 < 0x2000000) {
          uStack_60._0_4_ = SLTU;
        }
        else {
          uVar7 = (ulong)(uVar4 >> 0x19);
          if (uVar4 >> 0x19 != 1) {
            pcVar12 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
            uStack_60 = 3;
            goto LAB_001085b5;
          }
          uStack_60._0_4_ = MULHU;
        }
        break;
      case 4:
        if (uVar4 < 0x2000000) {
          uStack_60._0_4_ = XOR;
        }
        else {
          uVar7 = (ulong)(uVar4 >> 0x19);
          if (uVar4 >> 0x19 != 1) {
            pcVar12 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
            uStack_60 = 4;
            goto LAB_001085b5;
          }
          uStack_60._0_4_ = DIV;
        }
        break;
      case 5:
        if (uVar4 < 0x2000000) {
          uStack_60._0_4_ = SRL;
        }
        else {
          uVar5 = uVar4 >> 0x19;
          uVar7 = (ulong)uVar5;
          if (uVar5 == 0x20) {
            uStack_60._0_4_ = SRA;
          }
          else {
            if (uVar5 != 1) {
              pcVar12 = 
              "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
              ;
LAB_001085ab:
              uStack_60 = 5;
              goto LAB_001085b5;
            }
            uStack_60._0_4_ = DIVU;
          }
        }
        break;
      case 6:
        if (uVar4 < 0x2000000) {
          uStack_60._0_4_ = OR;
        }
        else {
          if (uVar4 >> 0x19 != 1) {
            pcVar12 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
LAB_0010857c:
            uVar7 = (ulong)(uVar4 >> 0x19);
            uStack_60 = 6;
LAB_001085b5:
            raiseError(this,pcVar12,uVar9,uVar7,uStack_60);
          }
          uStack_60._0_4_ = REM;
        }
        break;
      case 7:
        if (uVar4 < 0x2000000) {
          uStack_60._0_4_ = AND;
        }
        else {
          if (uVar4 >> 0x19 != 1) {
            pcVar12 = 
            "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
LAB_00108566:
            uVar7 = (ulong)(uVar4 >> 0x19);
            uStack_60 = 7;
            goto LAB_001085b5;
          }
          uStack_60._0_4_ = REMU;
        }
      }
LAB_00108304:
      local_54 = (InstSet)uStack_60;
      uVar5 = 0;
      uVar15 = uVar15 + (uVar4 >> 0x19) * 8;
      goto LAB_00108316;
    }
    if (uVar13 == 0x37) {
      uVar5 = uVar4 & 0xfffff000;
      uStack_60._0_4_ = LUI;
    }
    else {
      if (uVar13 == 0x3b) {
        switch(uVar7) {
        case 0:
          if (uVar4 < 0x2000000) {
            uStack_60._0_4_ = ADDW;
          }
          else if (uVar4 >> 0x19 == 1) {
            uStack_60._0_4_ = MULW;
          }
          else {
            if (uVar4 >> 0x19 != 0x20) {
              pcVar12 = 
              "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
              ;
              goto LAB_00108599;
            }
            uStack_60._0_4_ = SUBW;
          }
          break;
        case 1:
          uStack_60._0_4_ = SLLW;
          break;
        default:
          raiseError(this,
                     "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                     ,uVar9,(ulong)(uVar4 >> 0x19),(ulong)uVar15);
        case 4:
          uStack_60._0_4_ = DIVW;
          break;
        case 5:
          if (uVar4 < 0x2000000) {
            uStack_60._0_4_ = SRLW;
          }
          else {
            uVar5 = uVar4 >> 0x19;
            uVar7 = (ulong)uVar5;
            if (uVar5 == 0x20) {
              uStack_60._0_4_ = SRAW;
            }
            else {
              if (uVar5 != 1) {
                pcVar12 = 
                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n"
                ;
                goto LAB_001085ab;
              }
              uStack_60._0_4_ = DIVUW;
            }
          }
          break;
        case 6:
          if (uVar4 >> 0x19 != 1) {
            pcVar12 = 
            "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
            goto LAB_0010857c;
          }
          uStack_60._0_4_ = REMW;
          break;
        case 7:
          if (uVar4 >> 0x19 != 1) {
            pcVar12 = 
            "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n";
            goto LAB_00108566;
          }
          uStack_60._0_4_ = REMUW;
        }
        goto LAB_00108304;
      }
      if (uVar13 == 99) {
        if ((0xf3U >> (uVar4 >> 0xc & 7) & 1) != 0) {
          uVar14 = 0;
          local_54 = *(InstSet *)(&DAT_0010d178 + uVar7 * 4);
          uVar5 = (int)(uVar4 & 0x80000000 |
                       ((uVar6 & 1) << 0xb | uVar5 & 0x7e0 | uVar6 & 0x1e) << 0x13) >> 0x13;
          if (this->is_verbose == true) {
            uVar14 = 0;
            printf("\timm:%x",(ulong)uVar5);
          }
          goto LAB_00108316;
        }
        pcVar12 = "Invaild BRANCH Instruction at %x, The Func Field %x is invaild\n";
        goto LAB_001084d5;
      }
      if (uVar13 == 0x67) {
        local_50 = 0;
        local_54 = JALR;
        uVar8 = uVar4;
        goto LAB_0010804e;
      }
      if (uVar13 != 0x6f) {
        if (uVar13 != 0x73) {
          raiseError(this,"Invaild Instruction %x at %x\n",(ulong)uVar4,uVar9);
        }
        local_50 = 0x11;
        uVar15 = 0;
        local_54 = ECALL;
        uVar14 = 10;
        uVar5 = 0;
        uVar11 = uVar14;
        goto LAB_00108316;
      }
      uVar5 = (int)(uVar4 & 0x80000000 |
                   (uVar4 & 0xff000 | (uVar5 & 1) << 0xb | uVar5 & 0x7fe) << 0xb) >> 0xb;
      uStack_60._0_4_ = JAL;
    }
LAB_00107fba:
    uVar15 = 0;
    local_54 = (InstSet)uStack_60;
    uVar11 = 0;
  }
  local_50 = 0;
LAB_00108316:
  if (this->is_verbose == true) {
    printf("\tIF: %s",*(undefined8 *)(RISCV_GRX::INSTNAME + (ulong)local_54 * 8));
    printf("\tpc: %lx",uVar9);
  }
  if (uVar13 == 99) {
    bVar2 = BranchPredictor::predict(this->branch_predictor,(uint32_t)uVar9,(long)(int)uVar5);
    if (this->is_verbose == true) {
      pcVar12 = "not";
      if (bVar2) {
        pcVar12 = "";
      }
      printf("Predict: branch %staken.\n",pcVar12);
    }
    lVar10 = 4;
    if (bVar2) {
      lVar10 = (long)(int)uVar5;
    }
  }
  else if (uVar13 == 0x6f) {
    puVar1 = &(this->history).jal_count;
    *puVar1 = *puVar1 + 1;
    lVar10 = (long)(int)uVar5;
  }
  else {
    lVar10 = 4;
  }
  bVar3 = this->is_verbose;
  if ((bool)bVar3 == true) {
    printf("\tpred_pc: %lx\n",lVar10 + uVar9);
    bVar3 = this->is_verbose;
  }
  (this->f_reg).in.pred_pc = lVar10 + uVar9;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.opcode = uVar13;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.func = uVar15;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.rs1 = uVar11;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.rs2 = local_50;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.rd = uVar14;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.imm = uVar5;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.pc = uVar9;
  (this->d_reg).super_ClockReg<Simulator::DRegX>.in.inst = local_54;
  if ((bVar3 & 1) != 0) {
    printf("Fetch instruction 0x%x at 0x%lx\n",(ulong)uVar4,uVar9);
    return;
  }
  return;
}

Assistant:

void Simulator::fetch() {
//    if (e_reg.out.stall_count != 0)
//        return;
    uint64_t pc = f_reg.out.pred_pc;
    if (pc % 2 != 0) {
        this->raiseError("PC 0x%llx is illegal!\n", pc);
    }
    if (e_reg.out.opcode == OP_JALR) {
        pc = (uint64_t) (e_reg.out.val1 + e_reg.out.imm) & ~1LLu;
    }

    if (m_reg.out.opcode == OP_BRANCH) {
        history.branch_count++;
        bool b = branch_predictor->predict(m_reg.out.pc, m_reg.out.imm);
        branch_predictor->update(m_reg.out.pc, m_reg.out.valE);
        if (b ^ m_reg.out.valE) {
            pc = m_reg.out.pc + (b ? 4 : m_reg.out.imm);
            history.predicted_unsuccess++;
        } else {
            history.predicted_success++;
        }
    }

    uint32_t inst = memory->getInt(pc);
    if (is_verbose) {
        printf("\tINST:%x", inst);
    }
    InstSet inst_t = UNKNOWN;

    uint32_t opcode = inst & 0x7fu;
    uint32_t func = (inst >> 12u) & 0x7u;
    uint32_t rs1 = (inst >> 15u) & 0x1fu;
    uint32_t rs2 = (inst >> 20u) & 0x1fu;
    uint32_t rd = (inst >> 7u) & 0x1fu;
    int32_t imm = 0;
    //uint32_t stall_count = 1;

    if (inst == 0) {
        opcode = OP_BUBBLE;
    }

    switch (opcode) {
        case OP_ECALL:
            func = 0;
            rs1 = REG_A0;
            //rd = REG_A5;
            rd = REG_A0;
            rs2 = REG_A7;
            inst_t = ECALL;
            //stall_count = CALU_BIT;
            break;
        case OP_RR: {
            // R-Type
            switch (func) {
                case 0x0:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_ADD;
                        inst_t = ADD;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MUL;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_ADD;
                        inst_t = SUB;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x1:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLL;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULH;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x2:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLT;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULHSU;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x3:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SLTU;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL;
                        inst_t = MULHU;
                    } else
                        raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x4:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = XOR;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = DIV;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x5:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SRL;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_BIT;
                        inst_t = SRA;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = DIVU;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x6:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = OR;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = REM;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x7:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = AND;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV;
                        inst_t = REMU;
                    } else
                        this->raiseError(
                                "Invaild RR Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                default:
                    this->raiseError("Invaild RR Instruction at %x, The Func3 Field %x is invaild\n", pc, func);
                    break;
            }
            func |= inst >> 25u << 3u;
            break;
        }
        case OP_32: {
            switch (func) {
                case 0x0:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_ADD;
                        inst_t = ADDW;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_MUL_32;
                        inst_t = MULW;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_ADD;
                        inst_t = SUBW;
                    } else
                        this->raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLW;
                    break;
                case 0x4:
                    //stall_count = CALU_DIV_32;
                    inst_t = DIVW;
                    break;
                case 0x5:
                    if (inst >> 25u == 0x00) {
                        //stall_count = CALU_BIT;
                        inst_t = SRLW;
                    } else if (inst >> 25u == 0x20) {
                        //stall_count = CALU_BIT;
                        inst_t = SRAW;
                    } else if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = DIVUW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x6:
                    if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = REMW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                case 0x7:
                    if (inst >> 25u == 0x01) {
                        //stall_count = CALU_DIV_32;
                        inst_t = REMUW;
                    } else
                        raiseError(
                                "Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                                pc, inst >> 25u, func);
                    break;
                default:
                    raiseError("Invaild RRW Instruction at %x, The Func7 field is %x, The Func3 Field %x is invaild\n",
                               pc, inst >> 25u, func);
                    break;
            }
            func |= inst >> 25u << 3u;
            break;
        }
        case OP_JALR: // I-Type
            //stall_count = CALU_ADD;
            inst_t = JALR;
            rs2 = 0;
            imm = (int) inst >> 20u;
            break;
        case OP_LOAD:
            //stall_count = CALU_ADD;
            switch (func) {
                case 0x0:
                    inst_t = LB;
                    break;
                case 0x1:
                    inst_t = LH;
                    break;
                case 0x2:
                    inst_t = LW;
                    break;
                case 0x3:
                    inst_t = LD;
                    break;
                case 0x4:
                    inst_t = LBU;
                    break;
                case 0x5:
                    inst_t = LHU;
                    break;
                case 0x6:
                    inst_t = LWU;
                    break;
                default:
                    this->raiseError("Invaild LOAD Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20;
            break;
        case OP_IMM:
            switch (func) {
                case 0x0:
                    //stall_count = CALU_ADD;
                    inst_t = ADDI;
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLI;
                    break;
                case 0x2:
                    //stall_count = CALU_BIT;
                    inst_t = SLTI;
                    break;
                case 0x3:
                    //stall_count = CALU_BIT;
                    inst_t = SLTIU;
                    break;
                case 0x4:
                    //stall_count = CALU_BIT;
                    inst_t = XORI;
                    break;
                case 0x5: {
                    switch (inst >> 26u) {
                        case 0x00:
                            //stall_count = CALU_BIT;
                            inst_t = SRLI;
                            break;
                        case 0x10:
                            //stall_count = CALU_BIT;
                            inst_t = SRAI;
                            break;
                        default:
                            this->raiseError(
                                    "Invaild RI Instruction at %x, The Func3 field is %x, The Func7 Field %x is invaild\n",
                                    pc, inst >> 26u, func);
                            break;
                    }
                    break;
                }
                case 0x6:
                    //stall_count = CALU_BIT;
                    inst_t = ORI;
                    break;
                case 0x7:
                    //stall_count = CALU_BIT;
                    inst_t = ANDI;
                    break;
                default:
                    this->raiseError("Invaild RI Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20u;
            break;
        case OP_IMM_32:
            switch (func) {
                case 0x0:
                    //stall_count = CALU_ADD;
                    inst_t = ADDIW;
                    break;
                case 0x1:
                    //stall_count = CALU_BIT;
                    inst_t = SLLIW;
                    break;
                case 0x5:
                    if (inst >> 30u == 1) {
                        //stall_count = CALU_BIT;
                        inst_t = SRAIW;
                    } else if (inst >> 30u == 0) {
                        //stall_count = CALU_BIT;
                        inst_t = SRLIW;
                    } else {
                        this->raiseError("Invaild RIW Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    }
                    break;
                default:
                    this->raiseError("Invaild RIW Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rs2 = 0;
            imm = (int) inst >> 20;
            //is this right?
            break;
        case OP_STORE: // S-Type
            //stall_count = CALU_ADD;
            switch (func) {
                case 0x0:
                    inst_t = SB;
                    break;
                case 0x1:
                    inst_t = SH;
                    break;
                case 0x2:
                    inst_t = SW;
                    break;
                case 0x3:
                    inst_t = SD;
                    break;
                default:
                    this->raiseError("Invaild STORE Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rd = 0;
            imm = (inst >> 7u & 0x1fu) | inst >> 25u << 5u;
            imm = (int) imm << 20 >> 20;
            // is this right?
            break;
        case OP_BRANCH://SB-Type
            //stall_count = CALU_BIT;
            switch (func) {
                case 0x0:
                    inst_t = BEQ;
                    break;
                case 0x1:
                    inst_t = BNE;
                    break;
                case 0x4:
                    inst_t = BLT;
                    break;
                case 0x5:
                    inst_t = BGE;
                    break;
                case 0x6:
                    inst_t = BLTU;
                    break;
                case 0x7:
                    inst_t = BGEU;
                    break;
                default:
                    this->raiseError("Invaild BRANCH Instruction at %x, The Func Field %x is invaild\n", pc, func);
                    break;
            }
            rd = 0;
            imm = (inst >> 8u & 0xfu) << 1u | (inst >> 25u & 0x3fu) << 5u | (inst >> 7u & 0x1u) << 11u |
                  inst >> 31u << 12u;
            imm = (int) imm << 19u >> 19u;
            if (is_verbose) {
                printf("\timm:%x", imm);
            }
            // is this right?
            break;
        case OP_LUI://U-Type
            inst_t = LUI;
            //stall_count = CALU_BIT;
            func = rs1 = rs2 = 0;
            imm = (int) inst >> 12u << 12u;
            //is this right?
            break;
        case OP_AUIPC:
            inst_t = AUIPC;
            //stall_count = CALU_ADD;
            func = rs1 = rs2 = 0;
            imm = (int) inst >> 12u << 12u;
            // is this right?
            break;
        case OP_JAL://UJ-Type
            //stall_count = CALU_ADD;
            inst_t = JAL;
            func = rs1 = rs2 = 0;
            imm = (inst >> 21u & 0x3ffu) << 1u | (inst >> 20u & 1u) << 11u | (inst >> 12u & 0xffu) << 12u |
                  inst >> 31u << 20u;
            imm = (int) imm << 11u >> 11u;
            // is this right?
            break;
        case OP_BUBBLE:
            break;
        default:
            this->raiseError("Invaild Instruction %x at %x\n", inst, pc);
            break;

    }
    if (is_verbose) {
        printf("\tIF: %s", INSTNAME[inst_t]);
        printf("\tpc: %lx", pc);
    }
    uint64_t pred_pc;
    if (opcode == OP_JAL) {
        history.jal_count++;
        pred_pc = pc + imm;
    } else if (opcode == OP_BRANCH) {
        bool b = branch_predictor->predict(pc, imm);
        if (is_verbose) {
            printf("Predict: branch %staken.\n", b ? "" : "not");
        }
        pred_pc = pc + (b ? imm : 4);
    } else {
        pred_pc = pc + 4;
    }
    if (is_verbose) {
        printf("\tpred_pc: %lx\n", pred_pc);
    }
    f_reg.in.pred_pc = pred_pc;

    //d_reg.in.stall_count = stall_count;
    d_reg.in.opcode = opcode;
    d_reg.in.func = func;
    d_reg.in.rs1 = rs1;
    d_reg.in.rs2 = rs2;
    d_reg.in.rd = rd;
    d_reg.in.imm = imm;
    d_reg.in.pc = pc;
    d_reg.in.inst = inst_t;

    if (this->is_verbose) {
        printf("Fetch instruction 0x%x at 0x%lx\n", inst, pc);
    }
}